

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int w2r_(int *ldr,int *ldw,int *l,int *m,double *r__,double *w)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  
  uVar1 = *ldr;
  uVar2 = *ldw;
  uVar4 = *m;
  if (*m < 1) {
    uVar4 = 0;
  }
  pdVar6 = r__ + (long)(int)uVar1 + (long)(int)~uVar1 + 1;
  pdVar7 = w + (long)(int)uVar2 + (long)(int)~uVar2 + 1;
  for (uVar8 = 1; uVar8 != uVar4 + 1; uVar8 = uVar8 + 1) {
    uVar3 = *l;
    if (*l < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pdVar6[uVar5] = pdVar7[uVar5];
    }
    pdVar6 = pdVar6 + (int)uVar1;
    pdVar7 = pdVar7 + (int)uVar2;
  }
  return 0;
}

Assistant:

int w2r_(int *ldr, int *ldw, int *l, int *m,
	fft_real_t *r__, fft_real_t *w)
{
    /* System generated locals */
    int r_dim1, r_offset, w_dim1, w_offset, i__1, i__2;

    /* Local variables */
     int i__, j;

    /* Parameter adjustments */
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    w_dim1 = *ldw;
    w_offset = 1 + w_dim1;
    w -= w_offset;

    /* Function Body */
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *l;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    r__[i__ + j * r_dim1] = w[i__ + j * w_dim1];
	}
    }
    return 0;
}